

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parametric.cxx
# Opt level: O1

string * __thiscall
Parametric::getConfiguration_abi_cxx11_(string *__return_storage_ptr__,Parametric *this)

{
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  long *local_f0;
  long local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  ulong local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_50,"\"",&this->parametricName);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(this->parametricType)._M_dataplus._M_p);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
  puVar4 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar4) {
    local_c0 = *puVar4;
    lStack_b8 = plVar1[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar4;
    local_d0 = (ulong *)*plVar1;
  }
  local_c8 = plVar1[1];
  *plVar1 = (long)puVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  getAllParameters_abi_cxx11_(&local_b0,this);
  uVar5 = 0xf;
  if (local_d0 != &local_c0) {
    uVar5 = local_c0;
  }
  if (uVar5 < local_b0._M_string_length + local_c8) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar6 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_c8 <= (ulong)uVar6) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_0013d141;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
LAB_0013d141:
  local_f0 = &local_e0;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_e0 = *plVar1;
    uStack_d8 = puVar2[3];
  }
  else {
    local_e0 = *plVar1;
    local_f0 = (long *)*puVar2;
  }
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0);
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string Parametric::getConfiguration() const
{
	string config;
	config += "\"" + parametricName + "\" " + parametricType + '\n' + getAllParameters();
	return config;
}